

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_int>::aabbTest
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  uint uVar1;
  btDbvtBroadphase *pbVar2;
  Handle *pHVar3;
  bool bVar4;
  uint i;
  ulong uVar5;
  
  pbVar2 = this->m_raycastAccelerator;
  if (pbVar2 != (btDbvtBroadphase *)0x0) {
    (*(pbVar2->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[7])(pbVar2,aabbMin,aabbMax);
    return;
  }
  for (uVar5 = 1; uVar5 <= this->m_numHandles * 2; uVar5 = uVar5 + 1) {
    if ((this->m_pEdges[0][uVar5].m_pos & 1) != 0) {
      uVar1 = this->m_pEdges[0][uVar5].m_handle;
      pHVar3 = this->m_pHandles;
      bVar4 = TestAabbAgainstAabb2
                        (aabbMin,aabbMax,&pHVar3[uVar1].super_btBroadphaseProxy.m_aabbMin,
                         &pHVar3[uVar1].super_btBroadphaseProxy.m_aabbMax);
      if (bVar4) {
        (*callback->_vptr_btBroadphaseAabbCallback[2])(callback,pHVar3 + uVar1);
      }
    }
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->aabbTest(aabbMin,aabbMax,callback);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				Handle* handle = getHandle(m_pEdges[axis][i].m_handle);
				if (TestAabbAgainstAabb2(aabbMin,aabbMax,handle->m_aabbMin,handle->m_aabbMax))
				{
					callback.process(handle);
				}
			}
		}
	}
}